

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O0

void xsurv0_recv_cb(void *arg)

{
  nng_err nVar1;
  uint32_t pid;
  int iVar2;
  nni_msg *m;
  size_t sVar3;
  byte *data;
  bool bVar4;
  uint8_t *body;
  _Bool end;
  nni_msg *msg;
  xsurv0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x580));
  if (nVar1 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x580));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x580),(nni_msg *)0x0);
    pid = nni_pipe_id(*arg);
    nni_msg_set_pipe(m,pid);
    bVar4 = false;
    while (!bVar4) {
      sVar3 = nni_msg_len(m);
      if (sVar3 < 4) {
        nni_msg_free(m);
        nni_pipe_close(*arg);
        return;
      }
      data = (byte *)nni_msg_body(m);
      bVar4 = (*data & 0x80) != 0;
      iVar2 = nni_msg_header_append(m,data,4);
      if (iVar2 != 0) {
        nni_msg_free(m);
        nni_pipe_close(*arg);
        return;
      }
      nni_msg_trim(m,4);
    }
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1f0),m);
    nni_msgq_aio_put(*(nni_msgq **)(*(long *)((long)arg + 8) + 0x1e8),(nni_aio *)((long)arg + 0x1f0)
                    );
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xsurv0_recv_cb(void *arg)
{
	xsurv0_pipe *p = arg;
	nni_msg     *msg;
	bool         end;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->npipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_msg_set_pipe(msg, nni_pipe_id(p->npipe));
	end = false;

	while (!end) {
		uint8_t *body;

		if (nni_msg_len(msg) < 4) {
			// Peer gave us garbage, so kick it.
			nni_msg_free(msg);
			nni_pipe_close(p->npipe);
			return;
		}
		body = nni_msg_body(msg);
		end  = ((body[0] & 0x80u) != 0);

		if (nni_msg_header_append(msg, body, sizeof(uint32_t)) != 0) {
			// TODO: bump a no-memory stat
			nni_msg_free(msg);
			// Closing the pipe may release some memory.
			// It at least gives an indication to the peer
			// that we've lost the message.
			nni_pipe_close(p->npipe);
			return;
		}
		nni_msg_trim(msg, sizeof(uint32_t));
	}

	nni_aio_set_msg(&p->aio_putq, msg);
	nni_msgq_aio_put(p->psock->urq, &p->aio_putq);
}